

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void switch_mode(CPUARMState_conflict *env,int mode)

{
  long lVar1;
  undefined8 uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar3 = env->uncached_cpsr & 0x1f;
  if (uVar3 == mode) {
    return;
  }
  if (uVar3 == 0x11) {
    env->fiq_regs[4] = env->regs[0xc];
    uVar2 = *(undefined8 *)(env->regs + 10);
    *(undefined8 *)env->fiq_regs = *(undefined8 *)(env->regs + 8);
    *(undefined8 *)(env->fiq_regs + 2) = uVar2;
    uVar2 = *(undefined8 *)(env->usr_regs + 2);
    *(undefined8 *)(env->regs + 8) = *(undefined8 *)env->usr_regs;
    *(undefined8 *)(env->regs + 10) = uVar2;
    uVar4 = env->usr_regs[4];
  }
  else {
    if (mode != 0x11) goto LAB_00618a92;
    env->usr_regs[4] = env->regs[0xc];
    uVar2 = *(undefined8 *)(env->regs + 10);
    *(undefined8 *)env->usr_regs = *(undefined8 *)(env->regs + 8);
    *(undefined8 *)(env->usr_regs + 2) = uVar2;
    uVar2 = *(undefined8 *)(env->fiq_regs + 2);
    *(undefined8 *)(env->regs + 8) = *(undefined8 *)env->fiq_regs;
    *(undefined8 *)(env->regs + 10) = uVar2;
    uVar4 = env->fiq_regs[4];
  }
  env->regs[0xc] = uVar4;
LAB_00618a92:
  uVar3 = uVar3 - 0x10;
  if ((uVar3 < 0x10) && ((0x8ccfU >> (uVar3 & 0x1f) & 1) != 0)) {
    lVar1 = *(long *)(&DAT_00d7d478 + (ulong)uVar3 * 8);
    env->banked_r13[lVar1] = env->regs[0xd];
    env->banked_spsr[lVar1] = (ulong)env->spsr;
    uVar5 = mode - 0x10;
    if ((uVar5 < 0x10) && ((0x8ccfU >> (uVar5 & 0x1f) & 1) != 0)) {
      lVar1 = *(long *)(&DAT_00d7d478 + (ulong)uVar5 * 8);
      env->regs[0xd] = env->banked_r13[lVar1];
      env->spsr = (uint32_t)env->banked_spsr[lVar1];
      if ((((uVar3 < 0x10) && ((0x8ccfU >> (uVar3 & 0x1f) & 1) != 0)) &&
          (env->banked_r14[*(long *)(&DAT_00d7d4f8 + (ulong)uVar3 * 8)] = env->regs[0xe],
          uVar5 < 0x10)) && ((0x8ccfU >> (uVar5 & 0x1f) & 1) != 0)) {
        env->regs[0xe] = env->banked_r14[*(long *)(&DAT_00d7d4f8 + (ulong)uVar5 * 8)];
        return;
      }
    }
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
             ,0x99,(char *)0x0);
}

Assistant:

static void switch_mode(CPUARMState *env, int mode)
{
    int old_mode;
    int i;

    old_mode = env->uncached_cpsr & CPSR_M;
    if (mode == old_mode)
        return;

    if (old_mode == ARM_CPU_MODE_FIQ) {
        memcpy (env->fiq_regs, env->regs + 8, 5 * sizeof(uint32_t));
        memcpy (env->regs + 8, env->usr_regs, 5 * sizeof(uint32_t));
    } else if (mode == ARM_CPU_MODE_FIQ) {
        memcpy (env->usr_regs, env->regs + 8, 5 * sizeof(uint32_t));
        memcpy (env->regs + 8, env->fiq_regs, 5 * sizeof(uint32_t));
    }

    i = bank_number(old_mode);
    env->banked_r13[i] = env->regs[13];
    env->banked_spsr[i] = env->spsr;

    i = bank_number(mode);
    env->regs[13] = env->banked_r13[i];
    env->spsr = env->banked_spsr[i];

    env->banked_r14[r14_bank_number(old_mode)] = env->regs[14];
    env->regs[14] = env->banked_r14[r14_bank_number(mode)];
}